

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<127UL> * __thiscall GF2::WW<127UL>::operator=(WW<127UL> *this,word wRight)

{
  word in_RSI;
  WW<127UL> *in_RDI;
  size_t pos;
  ulong local_18;
  
  in_RDI->_words[0] = in_RSI;
  for (local_18 = 1; local_18 < 2; local_18 = local_18 + 1) {
    in_RDI->_words[local_18] = 0;
  }
  Trim(in_RDI);
  return in_RDI;
}

Assistant:

WW& operator=(word wRight)
	{	
		_words[0] = wRight;
		for (size_t pos = 1; pos < _wcount; pos++)
			_words[pos] = 0;
		Trim();
		return *this;
	}